

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_infill_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float fVar1;
  undefined8 *puVar2;
  llama_token_data *plVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  llama_token lVar9;
  ulong uVar10;
  size_t sVar11;
  size_t i1;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  size_t i;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  
  puVar2 = (undefined8 *)smpl->ctx;
  llama_sampler_softmax_impl(cur_p);
  fVar19 = 0.0;
  lVar12 = 0;
  fVar18 = 0.0;
  for (uVar15 = 0; sVar14 = cur_p->size, uVar15 < sVar14; uVar15 = uVar15 + 1) {
    bVar6 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                *(llama_token *)((long)&cur_p->data->id + lVar12));
    fVar1 = *(float *)((long)&cur_p->data->p + lVar12);
    if (bVar6) {
      fVar19 = fVar19 + fVar1;
    }
    else {
      fVar18 = fVar18 + fVar1;
    }
    lVar12 = lVar12 + 0xc;
  }
  if (fVar19 * 3.0 * (float)sVar14 <= fVar18) {
    for (uVar15 = 0; uVar15 < sVar14; uVar15 = uVar15 + 1) {
      lVar12 = 0;
      uVar13 = 0;
      while ((uVar13 < sVar14 && (plVar3 = cur_p->data, -INFINITY < plVar3[uVar15].logit))) {
        if ((uVar15 != uVar13) && (-INFINITY < *(float *)((long)&plVar3->logit + lVar12))) {
          uVar7 = llama_vocab::token_to_piece
                            ((llama_vocab *)*puVar2,plVar3[uVar15].id,(char *)puVar2[1],
                             *(int *)(puVar2 + 2) - (int)(char *)puVar2[1],0,false);
          if ((int)uVar7 < 0) {
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)(puVar2 + 1),(long)(int)uVar7);
            uVar7 = llama_vocab::token_to_piece
                              ((llama_vocab *)*puVar2,cur_p->data[uVar15].id,(char *)puVar2[1],
                               *(int *)(puVar2 + 2) - (int)(char *)puVar2[1],0,false);
          }
          iVar8 = llama_vocab::token_to_piece
                            ((llama_vocab *)*puVar2,
                             *(llama_token *)((long)&cur_p->data->id + lVar12),(char *)puVar2[4],
                             *(int *)(puVar2 + 5) - (int)(char *)puVar2[4],0,false);
          if (iVar8 < 0) {
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)(puVar2 + 4),(long)iVar8);
            iVar8 = llama_vocab::token_to_piece
                              ((llama_vocab *)*puVar2,
                               *(llama_token *)((long)&cur_p->data->id + lVar12),(char *)puVar2[4],
                               *(int *)(puVar2 + 5) - (int)(char *)puVar2[4],0,false);
          }
          if (((0 < (int)uVar7) && ((int)uVar7 <= iVar8)) &&
             (iVar8 = bcmp((((vector<char,_std::allocator<char>_> *)(puVar2 + 1))->
                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                           (((vector<char,_std::allocator<char>_> *)(puVar2 + 4))->
                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start,(ulong)uVar7), iVar8 == 0)) {
            plVar3 = cur_p->data;
            fVar18 = *(float *)((long)&plVar3->p + lVar12);
            bVar6 = fVar18 != plVar3[uVar15].p;
            bVar5 = plVar3[uVar15].p <= fVar18;
            uVar10 = uVar15;
            if (bVar5 && bVar6) {
              uVar10 = uVar13;
            }
            iVar8 = (int)uVar13;
            if (bVar5 && bVar6) {
              iVar8 = (int)uVar15;
            }
            plVar3[(int)uVar10].p = plVar3[iVar8].p + plVar3[(int)uVar10].p;
            plVar3[iVar8].logit = -INFINITY;
            plVar3[iVar8].p = 0.0;
          }
        }
        uVar13 = uVar13 + 1;
        sVar14 = cur_p->size;
        lVar12 = lVar12 + 0xc;
      }
    }
    cur_p->size = 0;
    fVar18 = 0.0;
    lVar12 = 0;
    lVar16 = 0;
    while (bVar6 = sVar14 != 0, sVar14 = sVar14 - 1, bVar6) {
      bVar6 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                  *(llama_token *)((long)&cur_p->data->id + lVar12));
      plVar3 = cur_p->data;
      fVar19 = *(float *)((long)&plVar3->p + lVar12);
      if ((bVar6) || (0.2 <= fVar19)) {
        lVar16 = lVar16 + (ulong)!bVar6;
        fVar18 = fVar18 + fVar19;
        sVar11 = cur_p->size;
        cur_p->size = sVar11 + 1;
        plVar3[sVar11].p = *(float *)((long)&plVar3->p + lVar12);
        uVar4 = *(undefined8 *)((long)&plVar3->id + lVar12);
        plVar3[sVar11].id = (int)uVar4;
        plVar3[sVar11].logit = (float)(int)((ulong)uVar4 >> 0x20);
      }
      lVar12 = lVar12 + 0xc;
    }
    if (lVar16 == 0) {
      cur_p->size = 1;
      lVar9 = llama_vocab::token_eot((llama_vocab *)*puVar2);
      plVar3 = cur_p->data;
      plVar3->id = lVar9;
      plVar3->logit = 1.0;
    }
    else {
      sVar14 = cur_p->size;
      lVar12 = 8;
      sVar11 = sVar14;
      while (bVar6 = sVar11 != 0, sVar11 = sVar11 - 1, bVar6) {
        *(float *)((long)&cur_p->data->id + lVar12) =
             *(float *)((long)&cur_p->data->id + lVar12) / fVar18;
        lVar12 = lVar12 + 0xc;
      }
      lVar16 = lVar16 + 1;
      auVar17._8_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar17._0_8_ = lVar16;
      auVar17._12_4_ = 0x45300000;
      cur_p->size = 0;
      fVar18 = 0.0;
      lVar12 = 0;
      while (bVar6 = sVar14 != 0, sVar14 = sVar14 - 1, bVar6) {
        bVar6 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                    *(llama_token *)((long)&cur_p->data->id + lVar12));
        plVar3 = cur_p->data;
        fVar19 = *(float *)((long)&plVar3->p + lVar12);
        if ((bVar6) ||
           ((float)(1.0 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0))) <=
            fVar19)) {
          fVar18 = fVar18 + fVar19;
          sVar11 = cur_p->size;
          cur_p->size = sVar11 + 1;
          plVar3[sVar11].p = *(float *)((long)&plVar3->p + lVar12);
          uVar4 = *(undefined8 *)((long)&plVar3->id + lVar12);
          plVar3[sVar11].id = (int)uVar4;
          plVar3[sVar11].logit = (float)(int)((ulong)uVar4 >> 0x20);
        }
        lVar12 = lVar12 + 0xc;
      }
      sVar14 = cur_p->size;
      lVar12 = 8;
      while (bVar6 = sVar14 != 0, sVar14 = sVar14 - 1, bVar6) {
        *(float *)((long)&cur_p->data->id + lVar12) =
             *(float *)((long)&cur_p->data->id + lVar12) / fVar18;
        lVar12 = lVar12 + 0xc;
      }
    }
  }
  else {
    cur_p->size = 0;
    fVar18 = 0.0;
    lVar12 = 0;
    while (bVar6 = sVar14 != 0, sVar14 = sVar14 - 1, bVar6) {
      bVar6 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                  *(llama_token *)((long)&cur_p->data->id + lVar12));
      if (bVar6) {
        plVar3 = cur_p->data;
        fVar18 = fVar18 + *(float *)((long)&plVar3->p + lVar12);
        sVar11 = cur_p->size;
        cur_p->size = sVar11 + 1;
        plVar3[sVar11].p = *(float *)((long)&plVar3->p + lVar12);
        uVar4 = *(undefined8 *)((long)&plVar3->id + lVar12);
        plVar3[sVar11].id = (int)uVar4;
        plVar3[sVar11].logit = (float)(int)((ulong)uVar4 >> 0x20);
      }
      lVar12 = lVar12 + 0xc;
    }
    sVar14 = cur_p->size;
    lVar12 = 8;
    while (bVar6 = sVar14 != 0, sVar14 = sVar14 - 1, bVar6) {
      *(float *)((long)&cur_p->data->id + lVar12) =
           *(float *)((long)&cur_p->data->id + lVar12) / fVar18;
      lVar12 = lVar12 + 0xc;
    }
  }
  return;
}

Assistant:

static void llama_sampler_infill_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_infill *) smpl->ctx;

    llama_sampler_softmax_impl(cur_p);

#if defined(GGML_DEBUG_SAMPLER_INFILL)
#define LOG_DBG_CUR LLAMA_LOG_DEBUG
#else
#define LOG_DBG_CUR(...)
#endif

    for (size_t i = 0; i < cur_p->size; ++i) {
        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    float p_txt_sum = 0.0f;
    float p_eog_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        if (ctx->vocab->is_eog(cur_p->data[i].id)) {
            p_eog_sum += cur_p->data[i].p;
        } else {
            p_txt_sum += cur_p->data[i].p;
        }
    }

    const float rat = p_eog_sum == 0.0 ? INFINITY : p_txt_sum / p_eog_sum; GGML_UNUSED(rat);

    LOG_DBG_CUR("%s: p_txt_sum = %.2f, p_eog_sum = %.2f, rat = %.2f, n = %zu\n", __func__, p_txt_sum, p_eog_sum, rat, cur_p->size);

    if (3*p_eog_sum*cur_p->size > p_txt_sum) {
        LOG_DBG_CUR("%s: the ratio p_txt/p_eog = %.2f is too low -> sampling EOG\n", __func__, p_txt_sum/p_eog_sum);

        // keep just the EOG tokens
        const auto size_org = cur_p->size;

        cur_p->size = 0;

        float p_sum = 0.0f;

        for (size_t i = 0; i < size_org; ++i) {
            if (ctx->vocab->is_eog(cur_p->data[i].id)) {
                p_sum += cur_p->data[i].p;

                cur_p->data[cur_p->size++] = cur_p->data[i];
            }
        }

        // normalize probs
        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= p_sum;
        }

        return;
    }

    size_t n_combined = 0; GGML_UNUSED(n_combined);

    // combine tokens with common prefix
    for (size_t i0 = 0; i0 < cur_p->size; ++i0) {
        for (size_t i1 = 0; i1 < cur_p->size; ++i1) {
            if (cur_p->data[i0].logit == -INFINITY) {
                break;
            }

            if (i0 == i1 || cur_p->data[i1].logit == -INFINITY) {
                continue;
            }

            int len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
            if (len0 < 0) {
                ctx->buf0.resize(len0);
                len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
                assert(len0 > 0);
            }

            int len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
            if (len1 < 0) {
                ctx->buf1.resize(len1);
                len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
                assert(len1 > 0);
            }

            // token i0 is a prefix of token i1
            if (len0 > 0 && len0 <= len1 && memcmp(ctx->buf0.data(), ctx->buf1.data(), len0) == 0) {
                int dst = i0;
                int src = i1;

                // merge into the token with higher probability
                if (cur_p->data[i1].p > cur_p->data[i0].p) {
                    std::swap(dst, src);
                }

                cur_p->data[dst].p += cur_p->data[src].p;
                cur_p->data[src].logit = -INFINITY;
                cur_p->data[src].p     = 0.0f;

                n_combined++;
            }
        }
    }

    size_t n_non_eog = 0;

    size_t size_org = cur_p->size;

    float p_sum = 0.0f;
    float thold = 0.2f;

    cur_p->size = 0;

    LOG_DBG_CUR("%s: n_combined = %zu, applying thold = %.3f\n", __func__, n_combined, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        if (!is_eog) {
            ++n_non_eog;
        }

        p_sum += cur_p->data[i].p;

        // keep this token
        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    LOG_DBG_CUR("%s: n_non_eog = %zu\n", __func__, n_non_eog);

    // if no non-EOG tokens are left -> reduce cur_p to single EOT token
    if (n_non_eog == 0) {
        cur_p->size = 1;
        cur_p->data[0].id = ctx->vocab->token_eot();
        cur_p->data[0].logit = 1.0f;

        return;
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    size_org = cur_p->size;
    p_sum = 0.0f;
    thold = 1.0/(n_non_eog + 1);

    cur_p->size = 0;

    LOG_DBG_CUR("%s: applying thold = %.3f\n", __func__, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        p_sum += cur_p->data[i].p;

        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

#undef LOG_DBG_CUR
}